

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall choc::value::Type::Object::Object(Object *this,Allocator *a,Object *other)

{
  uint32_t *puVar1;
  Content *pCVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  MemberNameAndType *pMVar6;
  char *pcVar7;
  ulong uVar8;
  MemberNameAndType *pMVar9;
  size_type size;
  MemberNameAndType *pMVar10;
  Type local_50;
  
  sVar4 = (other->className)._M_len;
  pcVar5 = (other->className)._M_str;
  if (a == (Allocator *)0x0) {
    pcVar7 = (char *)malloc(sVar4 + 1);
  }
  else {
    pcVar7 = (char *)(**(code **)(*(long *)a + 0x10))(a);
  }
  memcpy(pcVar7,pcVar5,sVar4);
  pcVar7[sVar4] = '\0';
  (this->className)._M_len = sVar4;
  (this->className)._M_str = pcVar7;
  (this->members).items = (MemberNameAndType *)0x0;
  (this->members).size = 0;
  (this->members).capacity = 0;
  (this->members).allocator = a;
  AllocatedVector<choc::value::MemberNameAndType>::reserve(&this->members,(other->members).size);
  uVar8 = (ulong)(other->members).size;
  if (uVar8 != 0) {
    pMVar10 = (other->members).items;
    pMVar9 = pMVar10 + uVar8;
    do {
      sVar4 = (pMVar10->name)._M_len;
      pcVar5 = (pMVar10->name)._M_str;
      if (a == (Allocator *)0x0) {
        pcVar7 = (char *)malloc(sVar4 + 1);
      }
      else {
        pcVar7 = (char *)(**(code **)(*(long *)a + 0x10))(a);
      }
      memcpy(pcVar7,pcVar5,sVar4);
      pcVar7[sVar4] = '\0';
      local_50.mainType = void_;
      local_50.content.object = (Object *)0x0;
      local_50.allocator = a;
      Type::operator=(&local_50,&pMVar10->type);
      AllocatedVector<choc::value::MemberNameAndType>::reserve
                (&this->members,(this->members).size + 1);
      pMVar6 = (this->members).items;
      uVar3 = (this->members).size;
      pMVar6[uVar3].name._M_len = sVar4;
      pMVar6[uVar3].name._M_str = pcVar7;
      pMVar6[uVar3].type.mainType = local_50.mainType;
      pCVar2 = &pMVar6[uVar3].type.content;
      pCVar2->object = local_50.content.object;
      (&pCVar2->object)[1] = (Object *)local_50.content._8_8_;
      pMVar6[uVar3].type.allocator = local_50.allocator;
      local_50.mainType = void_;
      puVar1 = &(this->members).size;
      *puVar1 = *puVar1 + 1;
      pMVar10 = pMVar10 + 1;
    } while (pMVar10 != pMVar9);
  }
  return;
}

Assistant:

Object (Allocator* a, const Object& other) : className (allocateString (a, other.className)), members (a)
    {
        members.reserve (other.members.size);

        for (auto& m : other.members)
            members.push_back ({ allocateString (a, m.name), Type (a, m.type) });
    }